

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool ConnectionExists(Curl_easy *data,connectdata *needle,connectdata **usethis,_Bool *force_reuse,
                      _Bool *waitpipe)

{
  _Bool _Var1;
  bool local_53;
  bool local_52;
  connectdata *pcStack_50;
  _Bool result;
  url_conn_match match;
  _Bool *waitpipe_local;
  _Bool *force_reuse_local;
  connectdata **usethis_local;
  connectdata *needle_local;
  Curl_easy *data_local;
  
  match._24_8_ = waitpipe;
  memset(&stack0xffffffffffffffb0,0,0x20);
  match.found = (connectdata *)data;
  match.data = (Curl_easy *)needle;
  _Var1 = Curl_xfer_may_multiplex(data,needle);
  local_52 = false;
  if (((data->state).authhost.want & 8) != 0) {
    local_52 = (needle->handler->protocol & 0xc0000003) != 0;
  }
  local_53 = false;
  if ((((ulong)needle->bits >> 2 & 1) != 0) &&
     (local_53 = false, ((data->state).authproxy.want & 8) != 0)) {
    local_53 = (needle->handler->protocol & 0xc0000003) != 0;
  }
  match.needle._0_1_ = (byte)match.needle & 0xf8 | _Var1 | local_52 << 1 | local_53 << 2;
  _Var1 = Curl_cpool_find(data,needle->destination,needle->destination_len,url_match_conn,
                          url_match_result,&stack0xffffffffffffffb0);
  *usethis = pcStack_50;
  *force_reuse = ((byte)match.needle >> 4 & 1) != 0;
  *(bool *)match._24_8_ = ((byte)match.needle >> 3 & 1) != 0;
  return _Var1;
}

Assistant:

static bool
ConnectionExists(struct Curl_easy *data,
                 struct connectdata *needle,
                 struct connectdata **usethis,
                 bool *force_reuse,
                 bool *waitpipe)
{
  struct url_conn_match match;
  bool result;

  memset(&match, 0, sizeof(match));
  match.data = data;
  match.needle = needle;
  match.may_multiplex = Curl_xfer_may_multiplex(data, needle);

#ifdef USE_NTLM
  match.want_ntlm_http = ((data->state.authhost.want & CURLAUTH_NTLM) &&
                          (needle->handler->protocol & PROTO_FAMILY_HTTP));
#ifndef CURL_DISABLE_PROXY
  match.want_proxy_ntlm_http =
    (needle->bits.proxy_user_passwd &&
     (data->state.authproxy.want & CURLAUTH_NTLM) &&
     (needle->handler->protocol & PROTO_FAMILY_HTTP));
#endif
#endif

  /* Find a connection in the pool that matches what "data + needle"
   * requires. If a suitable candidate is found, it is attached to "data". */
  result = Curl_cpool_find(data, needle->destination, needle->destination_len,
                           url_match_conn, url_match_result, &match);

  /* wait_pipe is TRUE if we encounter a bundle that is undecided. There
   * is no matching connection then, yet. */
  *usethis = match.found;
  *force_reuse = match.force_reuse;
  *waitpipe = match.wait_pipe;
  return result;
}